

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O1

int amqp_messenger_set_option(AMQP_MESSENGER_HANDLE messenger_handle,char *name,void *value)

{
  int iVar1;
  MAP_RESULT MVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  char *pcVar5;
  
  if ((name == (char *)0x0 || messenger_handle == (AMQP_MESSENGER_HANDLE)0x0) ||
      value == (void *)0x0) {
    p_Var3 = xlogging_get_log_function();
    iVar1 = 0x5dc;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x5dc;
    }
    pcVar5 = "Invalid argument (messenger_handle=%p, name=%p, value=%p)";
    iVar4 = 0x5db;
  }
  else {
    iVar1 = strcmp("amqp_event_send_timeout_secs",name);
    if (iVar1 == 0) {
      iVar1 = message_queue_set_max_message_enqueued_time_secs(messenger_handle->send_queue,*value);
      if (iVar1 == 0) {
        return 0;
      }
      p_Var3 = xlogging_get_log_function();
      iVar1 = 0x5e7;
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return 0x5e7;
      }
      pcVar5 = "Failed setting option %s";
      iVar4 = 0x5e6;
      messenger_handle = (AMQP_MESSENGER_HANDLE)"amqp_event_send_timeout_secs";
    }
    else {
      iVar1 = strcmp("product_info",name);
      if (iVar1 == 0) {
        MVar2 = Map_AddOrUpdate((messenger_handle->config->send_link).attach_properties,
                                "com.microsoft:client-version",(char *)value);
        if (MVar2 == MAP_OK) {
          MVar2 = Map_AddOrUpdate((messenger_handle->config->receive_link).attach_properties,
                                  "com.microsoft:client-version",(char *)value);
          if (MVar2 == MAP_OK) {
            return 0;
          }
          p_Var3 = xlogging_get_log_function();
          iVar1 = 0x5f9;
          if (p_Var3 == (LOGGER_LOG)0x0) {
            return 0x5f9;
          }
          pcVar5 = "Failed setting option %s for receive link";
          iVar4 = 0x5f8;
          messenger_handle = (AMQP_MESSENGER_HANDLE)"com.microsoft:client-version";
        }
        else {
          p_Var3 = xlogging_get_log_function();
          iVar1 = 0x5ff;
          if (p_Var3 == (LOGGER_LOG)0x0) {
            return 0x5ff;
          }
          pcVar5 = "Failed setting option %s for send link";
          iVar4 = 0x5fe;
          messenger_handle = (AMQP_MESSENGER_HANDLE)"com.microsoft:client-version";
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        iVar1 = 0x605;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return 0x605;
        }
        pcVar5 = "Invalid argument (option \'%s\' is not valid)";
        iVar4 = 0x604;
        messenger_handle = (AMQP_MESSENGER_HANDLE)name;
      }
    }
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
            ,"amqp_messenger_set_option",iVar4,1,pcVar5,messenger_handle);
  return iVar1;
}

Assistant:

int amqp_messenger_set_option(AMQP_MESSENGER_HANDLE messenger_handle, const char* name, void* value)
{
    int result;

    if (messenger_handle == NULL || name == NULL || value == NULL)
    {
        LogError("Invalid argument (messenger_handle=%p, name=%p, value=%p)",
            messenger_handle, name, value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_MESSENGER_INSTANCE* instance = (AMQP_MESSENGER_INSTANCE*)messenger_handle;

        if (strcmp(AMQP_MESSENGER_OPTION_EVENT_SEND_TIMEOUT_SECS, name) == 0)
        {
            if (message_queue_set_max_message_enqueued_time_secs(instance->send_queue, *(size_t*)value) != 0)
            {
                LogError("Failed setting option %s", AMQP_MESSENGER_OPTION_EVENT_SEND_TIMEOUT_SECS);
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }
        }
        else if(strcmp(OPTION_PRODUCT_INFO, name) == 0)
        {
            if (Map_AddOrUpdate(instance->config->send_link.attach_properties, CLIENT_VERSION_PROPERTY_NAME, value) == MAP_OK)
            {
                if (Map_AddOrUpdate(instance->config->receive_link.attach_properties, CLIENT_VERSION_PROPERTY_NAME, value) == MAP_OK)
                {
                    result = RESULT_OK;
                }
                else
                {
                    LogError("Failed setting option %s for receive link", CLIENT_VERSION_PROPERTY_NAME);
                    result = MU_FAILURE;
                }
            }
            else
            {
                LogError("Failed setting option %s for send link", CLIENT_VERSION_PROPERTY_NAME);
                result = MU_FAILURE;
            }
        }
        else
        {
            LogError("Invalid argument (option '%s' is not valid)", name);
            result = MU_FAILURE;
        }
    }

    return result;
}